

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrdp.cpp
# Opt level: O3

void __thiscall pg::RRDPSolver::run(RRDPSolver *this)

{
  vector<int,std::allocator<int>> *this_00;
  uint64_t *puVar1;
  iterator __position;
  pointer piVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  bool bVar11;
  ulong uVar12;
  ulong *puVar13;
  int *piVar14;
  int *piVar15;
  int *piVar16;
  long *plVar17;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var18;
  ostream *poVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __position_00;
  ulong uVar24;
  Game *pGVar25;
  pointer piVar26;
  long lVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  pointer *ppiVar31;
  ushort uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 in_ZMM2 [64];
  int p;
  int res;
  vector<int,_std::allocator<int>_> P;
  uint local_80;
  uint local_7c;
  int *local_78;
  ulong local_70;
  undefined1 local_68 [16];
  int *local_58;
  _label_vertex local_50;
  int *local_40;
  ulong local_38;
  
  pGVar25 = (this->super_RRSolver).super_PPSolver.super_Solver.game;
  uVar23 = pGVar25->n_vertices;
  local_78 = pGVar25->_priority;
  uVar28 = *(uint *)((long)local_78 + ((long)((uVar23 << 0x20) + -0x100000000) >> 0x1e));
  (this->super_RRSolver).super_PPSolver.max_prio = uVar28;
  uVar30 = (ulong)(int)(uVar28 + 1);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar30;
  uVar12 = SUB168(auVar5 * ZEXT816(0x18),0);
  uVar24 = uVar12 + 8;
  if (0xfffffffffffffff7 < uVar12) {
    uVar24 = 0xffffffffffffffff;
  }
  if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
    uVar24 = 0xffffffffffffffff;
  }
  puVar13 = (ulong *)operator_new__(uVar24);
  *puVar13 = uVar30;
  local_70 = (ulong)uVar28;
  if (uVar28 != 0xffffffff) {
    memset((vector<int,_std::allocator<int>_> *)(puVar13 + 1),0,
           ((uVar12 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  local_38 = uVar23 * 4;
  (this->super_RRSolver).super_PPSolver.regions = (vector<int,_std::allocator<int>_> *)(puVar13 + 1)
  ;
  uVar12 = -(ulong)(uVar23 >> 0x3e != 0) | local_38;
  piVar14 = (int *)operator_new__(uVar12);
  (this->super_RRSolver).super_PPSolver.region = piVar14;
  local_40 = (int *)operator_new__(uVar12);
  this->region_ = local_40;
  piVar15 = (int *)operator_new__(uVar12);
  uVar30 = uVar30 << 2;
  (this->super_RRSolver).super_PPSolver.strategy = piVar15;
  if ((int)local_70 < -1) {
    uVar30 = 0xffffffffffffffff;
  }
  piVar16 = (int *)operator_new__(uVar30);
  uVar12 = local_38;
  (this->super_RRSolver).super_PPSolver.inverse = piVar16;
  if (0 < (long)uVar23) {
    uVar24 = 0;
    puVar1 = ((this->super_RRSolver).super_PPSolver.super_Solver.disabled)->_bits;
    do {
      iVar29 = -2;
      if ((puVar1[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) == 0) {
        iVar29 = local_78[uVar24];
      }
      piVar14[uVar24] = iVar29;
      uVar24 = uVar24 + 1;
    } while (uVar23 != uVar24);
    if (0 < (long)uVar23) {
      memset(local_40,0xff,local_38);
      memset(piVar15,0xff,uVar12);
    }
  }
  uVar28 = (int)uVar23 - 1;
  (this->super_RRSolver).super_PPSolver.promotions = 0;
  uVar23 = 0;
  iVar29 = 0;
  local_70 = local_70 & 0xffffffff00000000;
  local_78 = (int *)((ulong)local_78 & 0xffffffff00000000);
  local_68 = (undefined1  [16])0x0;
  local_58 = (int *)0x0;
LAB_001561dc:
  if ((int)uVar28 < 0) {
    local_80 = 0xffffffff;
  }
  else {
    piVar14 = pGVar25->_priority;
    local_80 = piVar14[uVar28];
    do {
      uVar12 = (ulong)uVar28;
      if (piVar14[uVar12] != local_80) {
        pvVar3 = (this->super_RRSolver).super_PPSolver.regions;
        if (pvVar3[(int)local_80].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            pvVar3[(int)local_80].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
          PPSolver::resetRegion((PPSolver *)this,local_80);
        }
        goto LAB_001564b3;
      }
      if (((((this->super_RRSolver).super_PPSolver.super_Solver.disabled)->_bits[uVar28 >> 6] >>
            (uVar12 & 0x3f) & 1) == 0) &&
         ((this->super_RRSolver).super_PPSolver.region[uVar12] <= (int)local_80)) {
        (this->super_RRSolver).super_PPSolver.inverse[(int)local_80] = uVar28;
        iVar22 = piVar14[uVar12];
        in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
        iVar20 = (*(this->super_RRSolver).super_PPSolver.super_Solver._vptr_Solver[5])
                           (this,(ulong)local_80);
        bVar11 = PPSolver::setupRegion((PPSolver *)this,uVar28,iVar22,(bool)((byte)iVar20 ^ 1));
        if (bVar11) {
          uVar12 = (ulong)local_80;
          goto LAB_00156502;
        }
        goto LAB_0015667b;
      }
      bVar11 = 0 < (int)uVar28;
      uVar28 = uVar28 - 1;
    } while (bVar11);
  }
  lVar27 = pGVar25->n_vertices;
  iVar22 = (int)uVar23;
  if (0 < lVar27) {
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    in_ZMM2 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
    auVar36 = vpbroadcastq_avx512f();
    uVar23 = 0;
    do {
      auVar37 = vpbroadcastq_avx512f();
      auVar38 = vmovdqa64_avx512f(in_ZMM2);
      auVar39 = vporq_avx512f(auVar37,auVar34);
      auVar37 = vporq_avx512f(auVar37,auVar35);
      uVar7 = vpcmpuq_avx512f(auVar37,auVar36,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar39,auVar36,2);
      bVar9 = (byte)uVar7;
      uVar32 = CONCAT11(bVar9,bVar8);
      auVar37 = vmovdqu32_avx512f(*(undefined1 (*) [64])(this->region_ + uVar23));
      auVar39._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar37._4_4_;
      auVar39._0_4_ = (uint)(bVar8 & 1) * auVar37._0_4_;
      auVar39._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar37._8_4_;
      auVar39._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar37._12_4_;
      auVar39._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar37._16_4_;
      auVar39._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar37._20_4_;
      auVar39._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar37._24_4_;
      auVar39._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar37._28_4_;
      auVar39._32_4_ = (uint)(bVar9 & 1) * auVar37._32_4_;
      auVar39._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar37._36_4_;
      auVar39._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar37._40_4_;
      auVar39._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar37._44_4_;
      auVar39._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar37._48_4_;
      auVar39._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar37._52_4_;
      auVar39._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar37._56_4_;
      auVar39._60_4_ = (uint)(bVar9 >> 7) * auVar37._60_4_;
      uVar23 = uVar23 + 0x10;
      in_ZMM2 = vpmaxsd_avx512f(auVar38,auVar39);
    } while ((lVar27 + 0xfU & 0xfffffffffffffff0) != uVar23);
    auVar34 = vmovdqa32_avx512f(in_ZMM2);
    auVar35._0_4_ = (uint)(bVar8 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar38._0_4_;
    bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
    auVar35._4_4_ = (uint)bVar11 * auVar34._4_4_ | (uint)!bVar11 * auVar38._4_4_;
    bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
    auVar35._8_4_ = (uint)bVar11 * auVar34._8_4_ | (uint)!bVar11 * auVar38._8_4_;
    bVar11 = (bool)((byte)(uVar32 >> 3) & 1);
    auVar35._12_4_ = (uint)bVar11 * auVar34._12_4_ | (uint)!bVar11 * auVar38._12_4_;
    bVar11 = (bool)((byte)(uVar32 >> 4) & 1);
    auVar35._16_4_ = (uint)bVar11 * auVar34._16_4_ | (uint)!bVar11 * auVar38._16_4_;
    bVar11 = (bool)((byte)(uVar32 >> 5) & 1);
    auVar35._20_4_ = (uint)bVar11 * auVar34._20_4_ | (uint)!bVar11 * auVar38._20_4_;
    bVar11 = (bool)((byte)(uVar32 >> 6) & 1);
    auVar35._24_4_ = (uint)bVar11 * auVar34._24_4_ | (uint)!bVar11 * auVar38._24_4_;
    bVar11 = (bool)((byte)(uVar32 >> 7) & 1);
    auVar35._28_4_ = (uint)bVar11 * auVar34._28_4_ | (uint)!bVar11 * auVar38._28_4_;
    auVar35._32_4_ = (uint)(bVar9 & 1) * auVar34._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar38._32_4_;
    bVar11 = (bool)(bVar9 >> 1 & 1);
    auVar35._36_4_ = (uint)bVar11 * auVar34._36_4_ | (uint)!bVar11 * auVar38._36_4_;
    bVar11 = (bool)(bVar9 >> 2 & 1);
    auVar35._40_4_ = (uint)bVar11 * auVar34._40_4_ | (uint)!bVar11 * auVar38._40_4_;
    bVar11 = (bool)(bVar9 >> 3 & 1);
    auVar35._44_4_ = (uint)bVar11 * auVar34._44_4_ | (uint)!bVar11 * auVar38._44_4_;
    bVar11 = (bool)(bVar9 >> 4 & 1);
    auVar35._48_4_ = (uint)bVar11 * auVar34._48_4_ | (uint)!bVar11 * auVar38._48_4_;
    bVar11 = (bool)(bVar9 >> 5 & 1);
    auVar35._52_4_ = (uint)bVar11 * auVar34._52_4_ | (uint)!bVar11 * auVar38._52_4_;
    bVar11 = (bool)(bVar9 >> 6 & 1);
    auVar35._56_4_ = (uint)bVar11 * auVar34._56_4_ | (uint)!bVar11 * auVar38._56_4_;
    auVar35._60_4_ =
         (uint)(bVar9 >> 7) * auVar34._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar38._60_4_;
    auVar33 = vextracti64x4_avx512f(auVar35,1);
    auVar34 = vpmaxsd_avx512f(auVar35,ZEXT3264(auVar33));
    auVar5 = vpmaxsd_avx(auVar34._0_16_,auVar34._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpmaxsd_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpmaxsd_avx(auVar5,auVar6);
    uVar28 = auVar5._0_4_;
    if (uVar28 != 0xffffffff) {
      if ((this->super_RRSolver).super_PPSolver.super_Solver.trace != 0) {
        poVar19 = (this->super_RRSolver).super_PPSolver.super_Solver.logger;
        in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,"performing delayed promotions of player ",0x28);
        plVar17 = (long *)std::ostream::operator<<(poVar19,uVar28 & 1);
        std::ios::widen((char)*(undefined8 *)(*plVar17 + -0x18) + (char)plVar17);
        std::ostream::put((char)plVar17);
        std::ostream::flush();
        lVar27 = ((this->super_RRSolver).super_PPSolver.super_Solver.game)->n_vertices;
      }
      local_50.g = (Game *)((ulong)local_50.g & 0xffffffff00000000);
      if (0 < lVar27) {
        iVar20 = 0;
        lVar21 = 0;
        do {
          piVar14 = (this->super_RRSolver).super_PPSolver.region;
          if ((piVar14[lVar21] != 0xfffffffe) && (this->region_[lVar21] != -1)) {
            if (((piVar14[lVar21] ^ uVar28) & 1) == 0) {
              piVar14[lVar21] = this->region_[lVar21];
              this_00 = (vector<int,std::allocator<int>> *)
                        ((this->super_RRSolver).super_PPSolver.regions + piVar14[(int)local_50.g]);
              __position._M_current = *(int **)(this_00 + 8);
              if (__position._M_current == *(int **)(this_00 + 0x10)) {
                in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (this_00,__position,(int *)&local_50);
                lVar27 = ((this->super_RRSolver).super_PPSolver.super_Solver.game)->n_vertices;
              }
              else {
                *__position._M_current = (int)local_50.g;
                *(int **)(this_00 + 8) = __position._M_current + 1;
              }
            }
            this->region_[(int)local_50.g] = -1;
            iVar20 = (int)local_50.g;
          }
          iVar20 = iVar20 + 1;
          lVar21 = (long)iVar20;
          local_50.g = (Game *)CONCAT44(local_50.g._4_4_,iVar20);
        } while (lVar21 < lVar27);
      }
      if (local_68._8_8_ != local_68._0_8_) {
        local_68._8_8_ = local_68._0_8_;
      }
      if ((this->super_RRSolver).super_PPSolver.super_Solver.trace != 0) {
        poVar19 = (this->super_RRSolver).super_PPSolver.super_Solver.logger;
        in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,"finished performing delayed promotions",0x26);
        std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
        std::ostream::put((char)poVar19);
        std::ostream::flush();
      }
      iVar10 = (int)local_70;
      iVar29 = iVar29 + 1;
      local_70 = local_70 & 0xffffffff00000000;
      uVar28 = (this->super_RRSolver).super_PPSolver.inverse[uVar28];
      iVar20 = (int)local_78;
      if ((auVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        iVar20 = iVar10;
        iVar10 = (int)local_78;
      }
      piVar14 = &(this->super_RRSolver).super_PPSolver.promotions;
      *piVar14 = *piVar14 + iVar10;
      uVar23 = (ulong)(uint)(iVar22 + iVar20);
LAB_0015648b:
      local_78 = (int *)((ulong)local_78 & 0xffffffff00000000);
      goto LAB_001564b3;
    }
  }
  pvVar3 = (this->super_RRSolver).super_PPSolver.regions;
  if (pvVar3 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar26 = pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    ppiVar31 = &pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (piVar26 != (pointer)0x0) {
      lVar27 = (long)piVar26 * 0x18;
      do {
        pvVar4 = *(void **)((long)&pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar27);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,*(long *)((long)ppiVar31 + lVar27) - (long)pvVar4);
        }
        lVar27 = lVar27 + -0x18;
      } while (lVar27 != 0);
    }
    operator_delete__(ppiVar31,(long)piVar26 * 0x18 + 8);
  }
  piVar14 = (this->super_RRSolver).super_PPSolver.region;
  if (piVar14 != (int *)0x0) {
    operator_delete__(piVar14);
  }
  if (this->region_ != (int *)0x0) {
    operator_delete__(this->region_);
  }
  piVar14 = (this->super_RRSolver).super_PPSolver.strategy;
  if (piVar14 != (int *)0x0) {
    operator_delete__(piVar14);
  }
  piVar14 = (this->super_RRSolver).super_PPSolver.inverse;
  if (piVar14 != (int *)0x0) {
    operator_delete__(piVar14);
  }
  poVar19 = (this->super_RRSolver).super_PPSolver.super_Solver.logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"solved with ",0xc);
  poVar19 = (ostream *)
            std::ostream::operator<<(poVar19,(this->super_RRSolver).super_PPSolver.promotions);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," promotions, ",0xd);
  poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar29);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar19,"x performing delayed promotions (delayed ",0x29);
  poVar19 = (ostream *)std::ostream::operator<<(poVar19,this->delayed);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,", discarded ",0xc);
  poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar22);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,", total ",8);
  poVar19 = (ostream *)
            std::ostream::operator<<
                      (poVar19,iVar22 + (this->super_RRSolver).super_PPSolver.promotions);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,")",1);
  std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  if ((void *)local_68._0_8_ != (void *)0x0) {
    operator_delete((void *)local_68._0_8_,(long)local_58 - local_68._0_8_);
  }
  return;
  while (bVar11 = 0 < (int)uVar28, uVar28 = uVar28 - 1, bVar11) {
LAB_0015667b:
    if (((this->super_RRSolver).super_PPSolver.super_Solver.game)->_priority[uVar28] != local_80)
    goto LAB_001564b3;
  }
  goto LAB_00156929;
LAB_00156502:
  if (1 < (this->super_RRSolver).super_PPSolver.super_Solver.trace) {
    PPSolver::reportRegion((PPSolver *)this,(int)uVar12);
    uVar12 = (ulong)local_80;
  }
  local_7c = (*(this->super_RRSolver).super_PPSolver.super_Solver._vptr_Solver[4])
                       (this,(ulong)uVar28,uVar12);
  if (local_7c == 0xffffffff) {
    PPSolver::setDominion((PPSolver *)this,local_80);
    lVar27 = ((this->super_RRSolver).super_PPSolver.super_Solver.game)->n_vertices;
    if (0 < lVar27) {
      memset(this->region_,0xff,lVar27 * 4);
    }
    uVar28 = (int)lVar27 - 1;
    local_70 = local_70 & 0xffffffff00000000;
    if (local_68._8_8_ != local_68._0_8_) {
      local_68._8_8_ = local_68._0_8_;
    }
    goto LAB_0015648b;
  }
  if (local_7c == 0xfffffffe) {
    if ((int)uVar28 < 0) goto LAB_001564b3;
    goto LAB_00156911;
  }
  if (local_68._0_8_ != local_68._8_8_) {
    bVar11 = false;
    piVar14 = (int *)local_68._0_8_;
    do {
      piVar15 = piVar14 + 1;
      if ((*piVar14 < (int)local_7c & ((byte)*piVar14 ^ (byte)local_7c)) != 0) {
        bVar11 = true;
        break;
      }
      piVar14 = piVar15;
    } while (piVar15 != (int *)local_68._8_8_);
    if (bVar11) goto LAB_00156698;
  }
  uVar12 = ((this->super_RRSolver).super_PPSolver.super_Solver.game)->n_vertices;
  if (0 < (long)uVar12) {
    uVar24 = 0;
    do {
      if ((((((this->super_RRSolver).super_PPSolver.super_Solver.disabled)->_bits[uVar24 >> 6] >>
             (uVar24 & 0x3f) & 1) == 0) &&
          ((this->super_RRSolver).super_PPSolver.region[uVar24] < (int)local_7c)) &&
         ((int)local_7c <= this->region_[uVar24])) goto LAB_00156698;
      uVar24 = uVar24 + 1;
    } while (uVar12 != uVar24);
  }
  PPSolver::promote((PPSolver *)this,local_80,local_7c);
  _Var18 = std::
           __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_68._0_8_,
                      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_68._8_8_,(_Iter_equals_val<const_int>)&local_80);
  __position_00._M_current = (int *)local_68._8_8_;
  if (_Var18._M_current != (int *)local_68._8_8_) {
    local_68._8_8_ = _Var18._M_current;
    __position_00 = _Var18;
  }
  if (__position_00._M_current == local_58) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)local_68,(iterator)__position_00._M_current,
               (int *)&local_7c);
  }
  else {
    *__position_00._M_current = local_7c;
    local_68._8_8_ = __position_00._M_current + 1;
  }
  lVar27 = ((this->super_RRSolver).super_PPSolver.super_Solver.game)->n_vertices;
  if (0 < lVar27) {
    piVar14 = (this->super_RRSolver).super_PPSolver.region;
    piVar15 = this->region_;
    lVar21 = 0;
    do {
      if ((piVar14[lVar21] != 2) && (piVar15[lVar21] <= (int)local_7c)) {
        piVar15[lVar21] = -1;
      }
      lVar21 = lVar21 + 1;
    } while (lVar27 != lVar21);
  }
  local_80 = local_7c;
  uVar12 = (ulong)(int)local_7c;
  uVar28 = (this->super_RRSolver).super_PPSolver.inverse[uVar12];
  goto LAB_00156502;
  while (bVar11 = 0 < (int)uVar28, uVar28 = uVar28 - 1, bVar11) {
LAB_00156911:
    if (((this->super_RRSolver).super_PPSolver.super_Solver.game)->_priority[uVar28] != local_80)
    goto LAB_001564b3;
  }
LAB_00156929:
  uVar28 = 0xffffffff;
LAB_001564b3:
  pGVar25 = (this->super_RRSolver).super_PPSolver.super_Solver.game;
  goto LAB_001561dc;
LAB_00156698:
  iVar22 = (this->super_RRSolver).super_PPSolver.super_Solver.trace;
  if (iVar22 < 2) {
    if (iVar22 != 0) {
      poVar19 = (this->super_RRSolver).super_PPSolver.super_Solver.logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[1;33mdelayed \x1b[36m",0x14);
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,local_80);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[37mto \x1b[36m",0xe);
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,local_7c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
      std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
      goto LAB_00156817;
    }
  }
  else {
    poVar19 = (this->super_RRSolver).super_PPSolver.super_Solver.logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[1;33mdelayed \x1b[36m",0x14);
    poVar19 = (ostream *)std::ostream::operator<<(poVar19,local_80);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[37mto \x1b[36m",0xe);
    poVar19 = (ostream *)std::ostream::operator<<(poVar19,local_7c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m:",4);
    pvVar3 = (this->super_RRSolver).super_PPSolver.regions;
    local_40 = (int *)CONCAT44(local_40._4_4_,iVar29);
    piVar2 = pvVar3[(int)local_80].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_38 = uVar23;
    for (piVar26 = pvVar3[(int)local_80].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; piVar26 != piVar2; piVar26 = piVar26 + 1) {
      iVar29 = *piVar26;
      poVar19 = (this->super_RRSolver).super_PPSolver.super_Solver.logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[37m",6);
      local_50.g = (this->super_RRSolver).super_PPSolver.super_Solver.game;
      local_50.v = iVar29;
      poVar19 = operator<<(poVar19,&local_50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
    }
    poVar19 = (this->super_RRSolver).super_PPSolver.super_Solver.logger;
    std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
    uVar23 = local_38;
    iVar29 = (int)local_40;
LAB_00156817:
    std::ostream::put((char)poVar19);
    std::ostream::flush();
  }
  this->delayed = this->delayed + 1;
  pvVar3 = (this->super_RRSolver).super_PPSolver.regions;
  piVar14 = pvVar3[(int)local_80].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar15 = pvVar3[(int)local_80].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (piVar14 != piVar15) {
    piVar16 = this->region_;
    do {
      iVar22 = *piVar14;
      piVar14 = piVar14 + 1;
      piVar16[iVar22] = local_7c;
    } while (piVar14 != piVar15);
  }
  local_70 = CONCAT44(local_70._4_4_,(int)local_70 + (local_80 & 1));
  local_78 = (int *)CONCAT44(local_78._4_4_,(int)local_78 + (local_80 & 1 ^ 1));
  if ((int)uVar28 < 0) goto LAB_001564b3;
  do {
    if (((this->super_RRSolver).super_PPSolver.super_Solver.game)->_priority[uVar28] != local_80)
    goto LAB_001564b3;
    bVar11 = 0 < (int)uVar28;
    uVar28 = uVar28 - 1;
  } while (bVar11);
  goto LAB_00156929;
}

Assistant:

void
RRDPSolver::run()
{
    // obtain highest priority and allocate arrays
    max_prio = priority(nodecount()-1);
    regions = new std::vector<int>[max_prio+1];
    region = new int[nodecount()];
    region_ = new int[nodecount()];
    strategy = new int[nodecount()];
    inverse = new int[max_prio+1];

    // initialize arrays
    for (int i=0; i<nodecount(); i++) region[i] = disabled[i] ? -2 : priority(i);
    for (int i=0; i<nodecount(); i++) region_[i] = -1;
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // start loop at last node (highest priority)
    int i = nodecount() - 1;

    // reset statistics
    promotions = 0;
    int performances = 0;

    // set to track delayed promotions
    std::vector<int> P;
    int del0 = 0, del1 = 0, discarded = 0;

    /**
     * Two loops: the outer (normal) loop, and the inner (promotion-chain) loop.
     * The outer loop does region setup and attractor on the full region.
     * The inner loop only attracts from the promoted region.
     */

    while (true) {
        // get current priority and skip all disabled/attracted nodes
        int p = i < 0 ? -1 : priority(i);
        while (i >= 0 and priority(i) == p and (disabled[i] or region[i] > p)) i--;

        if (i < 0) {
            int max = -1;
            for (int i=0; i<nodecount(); i++) if (max < region_[i]) max = region_[i];
            if (max == -1) break; // done

            if (trace) logger << "performing delayed promotions of player " << (max&1) << std::endl;
            performances++;
            for (int i=0; i<nodecount(); i++) {
                if (region[i] == -2) continue;
                if (region_[i] != -1) {
                    if ((region[i]&1) == (max&1)) {
                        region[i] = region_[i];
                        regions[region[i]].push_back(i);
                    }
                    region_[i] = -1;
                }
            }
            P.clear();
            if (trace) logger << "finished performing delayed promotions" << std::endl;
            i = inverse[max];
            promotions += (max&1) ? del1 : del0;
            discarded += (max&1) ? del0 : del1;
            del0 = del1 = 0;
            continue;
        }

        // if empty, possibly reset and continue with next
        if (priority(i) != p) {
            if (!regions[p].empty()) resetRegion(p);
            continue;
        }

        inverse[p] = i;

        // RR-DP: only reset the region if:
        // - current node is promoted or attracted
        // - or region is empty
        // - or region does not fulfill conditions
        // This is checked by checkRegion()
        if (setupRegion(i, priority(i), !checkRegion(p))) {
            // region not empty, maybe promote
            while (true) {
                if (trace >= 2) reportRegion(p);
                int res = getRegionStatus(i, p);
                if (res == -2) {
                    // not closed, skip to next priority and break inner loop
                    while (i >= 0 and priority(i) == p) i--;
                    break;
                } else if (res == -1) {
                    // found dominion
                    setDominion(p);
                    // restart algorithm and break inner loop
                    i = nodecount() - 1;
                    // reset everything... (sadly)
                    // for (int j=0; j<nodecount(); j++) region[j] = disabled[j] ? -2 : priority(j);
                    // for (int j=0; j<nodecount(); j++) strategy[j] = -1;
                    for (int j=0; j<nodecount(); j++) region_[j] = -1;
                    P.clear();
                    del0 = del1 = 0;
                    break;
                } else {
                    // check if we are locked or not
                    bool locked = false;
                    for (auto l : P) {
                        if ((l&1) != (res&1) && l < res) {
                            locked = true;
                            break;
                        }
                    }
                    if (!locked) {
                        for (int i=0; i<nodecount(); i++) {
                            if (disabled[i]) continue;
                            if (region[i] < res && res <= region_[i]) {
                                // locked for reason b
                                locked = true;
                                break;
                            }
                        }
                    }
                    if (locked) {
                        // found delayed promotion
                        if (trace >= 2) {
                            logger << "\033[1;33mdelayed \033[36m" << p << " \033[37mto \033[36m" << res << "\033[m:";
                            for (int n : regions[p]) {
                                logger << " \033[37m" << label_vertex(n) << "\033[m";
                            }
                            logger << std::endl;
                        } else if (trace) {
                            logger << "\033[1;33mdelayed \033[36m" << p << " \033[37mto \033[36m" << res << "\033[m" << std::endl;
                        }
                        delayed++;
                        if (p&1) del1++;
                        else del0++;
                        // emulate delayed promotion in region_
                        for (int i : regions[p]) region_[i] = res;
                        // skip to next priority and break inner loop
                        while (i >= 0 and priority(i) == p) i--;
                        break;
                    } else {
                        // found promotion, perform it
                        promote(p, res);
                        // add promotion to P
                        P.erase(std::remove(P.begin(), P.end(), p), P.end());
                        P.push_back(res);
                        // remove from region_ below res
                        for (int i=0; i<nodecount(); i++) if (region[i] != 2 && region_[i] <= res) region_[i] = -1;
                        // continue loop with higher priority
                        i = inverse[res];
                        p = res;
                    }
                }
            }
        } else {
            // skip to next priority
            while (i >= 0 and priority(i) == p) i--;
        }
    }

    delete[] regions;
    delete[] region;
    delete[] region_;
    delete[] strategy;
    delete[] inverse;

    logger << "solved with " << promotions << " promotions, " << performances << "x performing delayed promotions (delayed " << delayed << ", discarded " << discarded << ", total " << promotions+discarded << ")" << std::endl;
}